

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.hpp
# Opt level: O0

bool __thiscall Player::operator==(Player *this,Player *p)

{
  __type _Var1;
  string *__lhs;
  string *__rhs;
  Player *p_local;
  Player *this_local;
  
  __lhs = BlackCard::getName_abi_cxx11_(&p->stronghold->super_BlackCard);
  __rhs = BlackCard::getName_abi_cxx11_(&this->stronghold->super_BlackCard);
  _Var1 = std::operator==(__lhs,__rhs);
  return _Var1;
}

Assistant:

bool operator==(const Player &p) const{ return p.stronghold->getName() == stronghold->getName(); }